

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

DiskFileToVirtualFileResult __thiscall
google::protobuf::compiler::DiskSourceTree::DiskFileToVirtualFile
          (DiskSourceTree *this,string *disk_file,string *virtual_file,string *shadowing_disk_file)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  char *__name;
  ZeroCopyInputStream *__p;
  string *in_RSI;
  long in_RDI;
  unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  stream;
  int i_1;
  int i;
  string canonical_disk_file;
  int mapping_index;
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff40;
  DiskSourceTree *in_stack_ffffffffffffff48;
  int local_88;
  int local_80;
  string local_70 [32];
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  int local_2c;
  DiskFileToVirtualFileResult local_4;
  
  local_2c = -1;
  std::__cxx11::string::string(local_70,in_RSI);
  CanonicalizePath(in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string(local_70);
  for (local_80 = 0;
      sVar3 = std::
              vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
              ::size((vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                      *)(in_RDI + 8)), (ulong)(long)local_80 < sVar3; local_80 = local_80 + 1) {
    in_stack_ffffffffffffff40 = (string *)(in_RDI + 8);
    pvVar4 = std::
             vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
             ::operator[]((vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                           *)in_stack_ffffffffffffff40,(long)local_80);
    in_stack_ffffffffffffff48 = (DiskSourceTree *)&pvVar4->disk_path;
    std::
    vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
    ::operator[]((vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                  *)in_stack_ffffffffffffff40,(long)local_80);
    bVar1 = ApplyMapping(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (bVar1) {
      local_2c = local_80;
      break;
    }
  }
  if (local_2c == -1) {
    local_4 = NO_MAPPING;
  }
  else {
    for (local_88 = 0; local_88 < local_2c; local_88 = local_88 + 1) {
      in_stack_ffffffffffffff20 =
           (vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
            *)(in_RDI + 8);
      std::
      vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
      ::operator[](in_stack_ffffffffffffff20,(long)local_88);
      std::
      vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
      ::operator[](in_stack_ffffffffffffff20,(long)local_88);
      bVar1 = ApplyMapping(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (bVar1) {
        __name = (char *)std::__cxx11::string::c_str();
        iVar2 = access(__name,0);
        if (-1 < iVar2) {
          local_4 = SHADOWED;
          goto LAB_00603831;
        }
      }
    }
    std::__cxx11::string::clear();
    __p = OpenDiskFile(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyInputStream,std::default_delete<google::protobuf::io::ZeroCopyInputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyInputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                *)in_stack_ffffffffffffff20,__p);
    bVar1 = std::operator==((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                             *)in_stack_ffffffffffffff20,__p);
    if (bVar1) {
      local_4 = CANNOT_OPEN;
    }
    else {
      local_4 = SUCCESS;
    }
    std::
    unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
                   *)in_stack_ffffffffffffff20);
  }
LAB_00603831:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return local_4;
}

Assistant:

DiskSourceTree::DiskFileToVirtualFileResult
DiskSourceTree::DiskFileToVirtualFile(const std::string& disk_file,
                                      std::string* virtual_file,
                                      std::string* shadowing_disk_file) {
  int mapping_index = -1;
  std::string canonical_disk_file = CanonicalizePath(disk_file);

  for (int i = 0; i < mappings_.size(); i++) {
    // Apply the mapping in reverse.
    if (ApplyMapping(canonical_disk_file, mappings_[i].disk_path,
                     mappings_[i].virtual_path, virtual_file)) {
      // Success.
      mapping_index = i;
      break;
    }
  }

  if (mapping_index == -1) {
    return NO_MAPPING;
  }

  // Iterate through all mappings with higher precedence and verify that none
  // of them map this file to some other existing file.
  for (int i = 0; i < mapping_index; i++) {
    if (ApplyMapping(*virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, shadowing_disk_file)) {
      if (access(shadowing_disk_file->c_str(), F_OK) >= 0) {
        // File exists.
        return SHADOWED;
      }
    }
  }
  shadowing_disk_file->clear();

  // Verify that we can open the file.  Note that this also has the side-effect
  // of verifying that we are not canonicalizing away any non-existent
  // directories.
  std::unique_ptr<io::ZeroCopyInputStream> stream(OpenDiskFile(disk_file));
  if (stream == NULL) {
    return CANNOT_OPEN;
  }

  return SUCCESS;
}